

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool __thiscall
GenericTransactionSignatureChecker<CMutableTransaction>::CheckECDSASignature
          (GenericTransactionSignatureChecker<CMutableTransaction> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSigIn,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchPubKey,CScript *scriptCode,
          SigVersion sigversion)

{
  Span<const_unsigned_char> _vch;
  bool bVar1;
  byte bVar2;
  uint nIn;
  byte *pbVar3;
  CScript *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int nHashType;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  uint256 sighash;
  CPubKey pubkey;
  SigVersion in_stack_000001f0;
  PrecomputedTransactionData *in_stack_000001f8;
  undefined4 in_stack_fffffffffffffef8;
  MissingDataBehavior in_stack_fffffffffffffefc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  Span<const_unsigned_char> *in_stack_ffffffffffffff08;
  undefined5 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  CAmount *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  int32_t in_stack_ffffffffffffff64;
  undefined1 local_98 [47];
  undefined1 local_69 [32];
  undefined1 local_49 [65];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (type)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  _vch.m_data._5_1_ = in_stack_ffffffffffffff15;
  _vch.m_data._0_5_ = in_stack_ffffffffffffff10;
  _vch.m_data._6_1_ = in_stack_ffffffffffffff16;
  _vch.m_data._7_1_ = in_stack_ffffffffffffff17;
  _vch.m_size = (size_t)in_RDI;
  CPubKey::CPubKey((CPubKey *)in_stack_ffffffffffffff08,_vch);
  bVar1 = CPubKey::IsValid((CPubKey *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
  ;
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_RSI,in_RDX);
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff08);
    if (bVar1) {
      bVar2 = false;
    }
    else {
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      nIn = (uint)*pbVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if ((in_R8D == 1) && (in_RDI[3] < 0)) {
        bVar2 = HandleMissingData(in_stack_fffffffffffffefc);
      }
      else {
        SignatureHash<CMutableTransaction>
                  (in_RCX,(CMutableTransaction *)CONCAT44(in_R8D,in_stack_ffffffffffffff38),nIn,
                   in_stack_ffffffffffffff64,in_stack_ffffffffffffff28,in_stack_000001f0,
                   in_stack_000001f8);
        bVar2 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_98,local_49,local_69);
        if ((bVar2 & 1) == 0) {
          bVar2 = false;
        }
        else {
          bVar2 = true;
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff08);
  }
  else {
    bVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool GenericTransactionSignatureChecker<T>::CheckECDSASignature(const std::vector<unsigned char>& vchSigIn, const std::vector<unsigned char>& vchPubKey, const CScript& scriptCode, SigVersion sigversion) const
{
    CPubKey pubkey(vchPubKey);
    if (!pubkey.IsValid())
        return false;

    // Hash type is one byte tacked on to the end of the signature
    std::vector<unsigned char> vchSig(vchSigIn);
    if (vchSig.empty())
        return false;
    int nHashType = vchSig.back();
    vchSig.pop_back();

    // Witness sighashes need the amount.
    if (sigversion == SigVersion::WITNESS_V0 && amount < 0) return HandleMissingData(m_mdb);

    uint256 sighash = SignatureHash(scriptCode, *txTo, nIn, nHashType, amount, sigversion, this->txdata);

    if (!VerifyECDSASignature(vchSig, pubkey, sighash))
        return false;

    return true;
}